

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall wabt::Var::set_name(Var *this,string_view name)

{
  allocator<char> local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  string local_30;
  
  local_40._M_str = name._M_str;
  local_40._M_len = name._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_30,&local_40,&local_41);
  set_name(this,&local_30);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void Var::set_name(std::string_view name) {
  set_name(std::string(name));
}